

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

void __thiscall
pbrt::SingleLevelFlattener::traverse(SingleLevelFlattener *this,SP *object,affine3f *xfm)

{
  element_type *peVar1;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<pbrt::Instance> inst_1;
  SP emittedShape;
  SP inst;
  __shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_90 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  __shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_60 [48];
  
  if ((object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,&object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
    getOrCreateEmittedShapeFrom((SingleLevelFlattener *)local_90,&this->result);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    if ((element_type *)local_90._0_8_ != (element_type *)0x0) {
      std::make_shared<pbrt::Instance,std::shared_ptr<pbrt::Object>&,pbrt::math::affine3f_const&>
                ((shared_ptr<pbrt::Object> *)local_60,(affine3f *)local_90);
      if ((element_type *)local_60._0_8_ != (element_type *)0x0) {
        std::
        vector<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>::
        push_back(&((this->result).super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->instances,(value_type *)local_60);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    }
    peVar1 = (object->super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var2 = &((peVar1->instances).
               super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>;
    for (p_Var3 = &((peVar1->instances).
                    super__Vector_base<std::shared_ptr<pbrt::Instance>,_std::allocator<std::shared_ptr<pbrt::Instance>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>; p_Var3 != p_Var2;
        p_Var3 = p_Var3 + 1) {
      std::__shared_ptr<pbrt::Instance,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_a0,p_Var3);
      if (local_a0._M_ptr != (element_type *)0x0) {
        std::__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x10),
                   &((local_a0._M_ptr)->object).
                    super___shared_ptr<pbrt::Object,_(__gnu_cxx::_Lock_policy)2>);
        math::operator*((affine3f *)local_60,xfm,&(local_a0._M_ptr)->xfm);
        traverse(this,(SP *)(local_90 + 0x10),(affine3f *)local_60);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
  }
  return;
}

Assistant:

void traverse(Object::SP object, const affine3f &xfm)
    {
      if (!object)
        return;
      
      Object::SP emittedShape = getOrCreateEmittedShapeFrom(object);
      if (emittedShape) {
        Instance::SP inst
          = std::make_shared<Instance>(emittedShape,xfm);
        if (inst)
          result->instances.push_back(inst);
      }
      
      for (auto inst : object->instances) {
        if (inst)
          traverse(inst->object,xfm * inst->xfm);
      }
    }